

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XTemplateSerializer.cpp
# Opt level: O2

void xercesc_4_0::XTemplateSerializer::storeObject
               (RefHashTableOf<xercesc_4_0::XSAnnotation,_xercesc_4_0::PtrHasher> *objToStore,
               XSerializeEngine *serEng)

{
  uint ui;
  XMLSize_t XVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  uint *puVar4;
  void **ppvVar5;
  XSAnnotation *pXVar6;
  RefHashTableOf<xercesc_4_0::XSAnnotation,_xercesc_4_0::PtrHasher> *__n;
  void *__buf;
  XMLSize_t i;
  XMLSize_t getAt;
  XSerializedObjectId_t keyId;
  ValueVectorOf<unsigned_int> local_c0;
  RefHashTableOf<xercesc_4_0::XSAnnotation,_xercesc_4_0::PtrHasher> *local_98;
  void *key;
  ValueVectorOf<void_*> local_88;
  RefHashTableOfEnumerator<xercesc_4_0::XSAnnotation,_xercesc_4_0::PtrHasher> e;
  
  bVar2 = XSerializeEngine::needToStoreObject(serEng,objToStore);
  if (bVar2) {
    XSerializeEngine::writeSize(serEng,objToStore->fHashModulus);
    RefHashTableOfEnumerator<xercesc_4_0::XSAnnotation,_xercesc_4_0::PtrHasher>::
    RefHashTableOfEnumerator(&e,objToStore,false,objToStore->fMemoryManager);
    local_c0.fMemoryManager = XSerializeEngine::getMemoryManager(serEng);
    local_c0.fCallDestructor = false;
    local_c0.fCurCount = 0;
    local_c0.fMaxCount = 0x10;
    iVar3 = (*(local_c0.fMemoryManager)->_vptr_MemoryManager[3])(local_c0.fMemoryManager);
    local_c0.fElemList = (uint *)CONCAT44(extraout_var,iVar3);
    local_98 = objToStore;
    memset(local_c0.fElemList,0,local_c0.fMaxCount << 2);
    local_88.fMemoryManager = XSerializeEngine::getMemoryManager(serEng);
    local_88.fCallDestructor = false;
    local_88.fCurCount = 0;
    local_88.fMaxCount = 0x10;
    iVar3 = (*(local_88.fMemoryManager)->_vptr_MemoryManager[3])(local_88.fMemoryManager,0x80);
    local_88.fElemList = (void **)CONCAT44(extraout_var_00,iVar3);
    local_88.fElemList[0xe] = (void *)0x0;
    local_88.fElemList[0xf] = (void *)0x0;
    local_88.fElemList[0xc] = (void *)0x0;
    local_88.fElemList[0xd] = (void *)0x0;
    local_88.fElemList[10] = (void *)0x0;
    local_88.fElemList[0xb] = (void *)0x0;
    local_88.fElemList[8] = (void *)0x0;
    local_88.fElemList[9] = (void *)0x0;
    local_88.fElemList[6] = (void *)0x0;
    local_88.fElemList[7] = (void *)0x0;
    local_88.fElemList[4] = (void *)0x0;
    local_88.fElemList[5] = (void *)0x0;
    local_88.fElemList[2] = (void *)0x0;
    local_88.fElemList[3] = (void *)0x0;
    *local_88.fElemList = (void *)0x0;
    local_88.fElemList[1] = (void *)0x0;
    while ((XVar1 = local_c0.fCurCount,
           e.fCurElem != (RefHashTableBucketElem<xercesc_4_0::XSAnnotation> *)0x0 ||
           (e.fCurHash != (e.fToEnum)->fHashModulus))) {
      key = RefHashTableOfEnumerator<xercesc_4_0::XSAnnotation,_xercesc_4_0::PtrHasher>::
            nextElementKey(&e);
      keyId = XSerializeEngine::lookupStorePool(serEng,key);
      if (keyId != 0) {
        ValueVectorOf<unsigned_int>::addElement(&local_c0,&keyId);
        ValueVectorOf<void_*>::addElement(&local_88,&key);
      }
    }
    XSerializeEngine::writeSize(serEng,local_c0.fCurCount);
    __n = e.fToEnum;
    for (getAt = 0; XVar1 != getAt; getAt = getAt + 1) {
      puVar4 = ValueVectorOf<unsigned_int>::elementAt(&local_c0,getAt);
      ui = *puVar4;
      ppvVar5 = ValueVectorOf<void_*>::elementAt(&local_88,getAt);
      pXVar6 = RefHashTableOf<xercesc_4_0::XSAnnotation,_xercesc_4_0::PtrHasher>::get
                         (local_98,*ppvVar5);
      XSerializeEngine::operator<<(serEng,ui);
      XSerializeEngine::write(serEng,(int)pXVar6,__buf,(size_t)__n);
    }
    ValueVectorOf<void_*>::~ValueVectorOf(&local_88);
    ValueVectorOf<unsigned_int>::~ValueVectorOf(&local_c0);
    RefHashTableOfEnumerator<xercesc_4_0::XSAnnotation,_xercesc_4_0::PtrHasher>::
    ~RefHashTableOfEnumerator(&e);
  }
  return;
}

Assistant:

void XTemplateSerializer::storeObject(RefHashTableOf<XSAnnotation, PtrHasher>* const objToStore
                                    , XSerializeEngine&              serEng)
{
    if (serEng.needToStoreObject(objToStore))
    {
        serEng.writeSize (objToStore->getHashModulus());

        RefHashTableOfEnumerator<XSAnnotation, PtrHasher> e(objToStore, false, objToStore->getMemoryManager());

#ifdef XERCES_DEBUG_SORT_GRAMMAR
        //get the total item number
        unsigned int   itemNumber = 0;
        while (e.hasMoreElements())
        {
            void* key = e.nextElementKey();
            XSerializeEngine::XSerializedObjectId_t keyId = serEng.lookupStorePool(key);

            if (keyId)
                itemNumber++;
        }

        serEng.writeSize (itemNumber);
        e.Reset();

        //to sort the key
        //though keyId is not supposed to be involved in compare
        //we merely use the KeySet to encap both the string key and keyid
        SortArray sortArray(itemNumber, objToStore->getMemoryManager());
        while (e.hasMoreElements())
        {
            void* key = e.nextElementKey();
            XSerializeEngine::XSerializedObjectId_t keyId = serEng.lookupStorePool(key);

            if (keyId)
            {
                KeySet* keySet =
                    new (objToStore->getMemoryManager()) KeySet((XMLCh*)key, keyId, 0, objToStore->getMemoryManager());
                sortArray.addElement(keySet);
            }

        }

        sortArray.sort();

        //to store the data
        for (XMLSize_t i=0; i < itemNumber; i++)
        {
            GET_NEXT_KEYSET()

            XSerializeEngine::XSerializedObjectId_t keyId = (XSerializeEngine::XSerializedObjectId_t)intKey1;
            XSAnnotation* data = objToStore->get(strKey);

            serEng<<keyId;
            serEng<<data;
        }
#else
        ValueVectorOf<XSerializeEngine::XSerializedObjectId_t> ids(16, serEng.getMemoryManager());
        ValueVectorOf<void*> keys(16, serEng.getMemoryManager());

        while (e.hasMoreElements())
        {
            void* key = e.nextElementKey();
            XSerializeEngine::XSerializedObjectId_t keyId = serEng.lookupStorePool(key);

            if (keyId)
            {
                ids.addElement(keyId);
                keys.addElement(key);
            }
        }

        XMLSize_t itemNumber = ids.size();
        serEng.writeSize (itemNumber);

        for (XMLSize_t i=0; i<itemNumber; i++)
        {
            XSerializeEngine::XSerializedObjectId_t keyId = ids.elementAt(i);
            XSAnnotation* data = objToStore->get(keys.elementAt(i));
            serEng<<keyId;
            serEng<<data;
        }
#endif
    }
}